

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseFuncModuleField(WastParser *this,Module *module)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result RVar2;
  Index binding_index_offset;
  pointer pFVar3;
  pointer pFVar4;
  BindingHash *bindings;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> local_1f0;
  Enum local_1e8;
  Enum local_1e4;
  undefined1 local_1e0 [8];
  ResolveFuncs references;
  Location local_1a0;
  Func *local_180;
  Func *func_1;
  __single_object field_1;
  Location local_168;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> local_148;
  __single_object field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string asStack_118 [32];
  string asStack_f8 [32];
  iterator local_d8;
  size_type local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  Enum local_b0;
  Enum local_ac;
  Enum local_a8;
  Enum local_a4;
  Func *local_a0;
  Func *func;
  __single_object import;
  undefined1 local_88 [8];
  ModuleFieldList export_fields;
  string name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)local_48,this);
    RVar2 = Expect(this,First_RefKind);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::__cxx11::string::string((string *)&export_fields.size_);
      ParseBindVarOpt(this,(string *)&export_fields.size_);
      intrusive_list<wabt::ModuleField>::intrusive_list
                ((intrusive_list<wabt::ModuleField> *)local_88);
      import._M_t.super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
      super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._4_4_ =
           ParseInlineExports(this,(ModuleFieldList *)local_88,First);
      bVar1 = Failed(import._M_t.
                     super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                     .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
        _M_t.super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
        super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        bVar1 = PeekMatchLpar(this,Import);
        if (bVar1) {
          CheckImportOrdering(this,module);
          std::make_unique<wabt::FuncImport,std::__cxx11::string&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func);
          pFVar3 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::
                   operator->((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>
                               *)&func);
          local_a0 = &pFVar3->func;
          pFVar3 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::get
                             ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>
                               *)&func);
          local_a4 = (Enum)ParseInlineImport(this,(Import *)pFVar3);
          bVar1 = Failed((Result)local_a4);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            local_a8 = (Enum)ParseTypeUseOpt(this,&local_a0->decl);
            bVar1 = Failed((Result)local_a8);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
              super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
              super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              local_ac = (Enum)ParseFuncSignature(this,&(local_a0->decl).sig,&local_a0->bindings);
              bVar1 = Failed((Result)local_ac);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                import._M_t.
                super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t
                .super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
                super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_138,"type",
                           (allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 7));
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (asStack_118,"param",
                           (allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 6));
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (asStack_f8,"result",
                           (allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 5));
                local_d8 = &local_138;
                local_d0 = 3;
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)((long)&field._M_t.
                                       super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                       _M_head_impl + 4));
                __l._M_len = local_d0;
                __l._M_array = local_d8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_c8,__l,
                         (allocator_type *)
                         ((long)&field._M_t.
                                 super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                 .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                 _M_head_impl + 4));
                local_b0 = (Enum)ErrorIfLpar(this,&local_c8,(char *)0x0);
                bVar1 = Failed((Result)local_b0);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_c8);
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)((long)&field._M_t.
                                        super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                        _M_head_impl + 4));
                local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_d8;
                do {
                  local_208 = local_208 + -1;
                  std::__cxx11::string::~string((string *)local_208);
                } while (local_208 != &local_138);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 5));
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 6));
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 7));
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
                }
                else {
                  GetLocation(&local_168,this);
                  std::
                  make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location>
                            (&local_148,(Location *)&func);
                  std::
                  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                  ::unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                *)&field_1,
                               (unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                *)&local_148);
                  Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                              *)&field_1);
                  std::
                  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                  ::~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                 *)&field_1);
                  std::
                  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                  ::~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                 *)&local_148);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 0;
                }
              }
            }
          }
          std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::~unique_ptr
                    ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)&func);
        }
        else {
          std::make_unique<wabt::FuncModuleField,wabt::Location&,std::__cxx11::string&>
                    ((Location *)&func_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
          pFVar4 = std::
                   unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
                   operator->((unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                               *)&func_1);
          local_180 = &pFVar4->func;
          GetLocation(&local_1a0,this);
          (local_180->loc).filename._M_len = local_1a0.filename._M_len;
          (local_180->loc).filename._M_str = local_1a0.filename._M_str;
          (local_180->loc).field_1.field_1.offset = (size_t)local_1a0.field_1.field_1.offset;
          *(undefined8 *)((long)&(local_180->loc).field_1 + 8) = local_1a0.field_1._8_8_;
          references.vars.
          super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               ParseTypeUseOpt(this,&local_180->decl);
          bVar1 = Failed(references.vars.
                         super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            references.vars.
            super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 ParseFuncSignature(this,&(local_180->decl).sig,&local_180->bindings);
            bVar1 = Failed(references.vars.
                           super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
              super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
              super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              ResolveFuncs::ResolveFuncs((ResolveFuncs *)local_1e0,local_180);
              bindings = &local_180->bindings;
              binding_index_offset = Func::GetNumParams(local_180);
              local_1e4 = (Enum)ParseBoundValueTypeList
                                          (this,Local,(TypeVector *)&references,bindings,
                                           (ReferenceVars *)
                                           &references.types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                           binding_index_offset);
              bVar1 = Failed((Result)local_1e4);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                import._M_t.
                super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t
                .super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
                super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
              }
              else {
                bVar1 = std::
                        vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                        ::empty((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                                 *)&references.types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
                if (bVar1) {
                  LocalTypes::Set(&local_180->local_types,(TypeVector *)&references);
                }
                else {
                  std::
                  vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
                  ::push_back(&this->resolve_funcs_,(value_type *)local_1e0);
                }
                local_1e8 = (Enum)ParseTerminatingInstrList(this,&local_180->exprs);
                bVar1 = Failed((Result)local_1e8);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
                }
                else {
                  std::
                  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
                  unique_ptr(&local_1f0,
                             (unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                              *)&func_1);
                  Module::AppendField(module,&local_1f0);
                  std::
                  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
                  ~unique_ptr(&local_1f0);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 0;
                }
              }
              ResolveFuncs::~ResolveFuncs((ResolveFuncs *)local_1e0);
            }
          }
          std::unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
          ~unique_ptr((unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                       *)&func_1);
        }
        if ((int)import._M_t.
                 super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
                 super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl == 0) {
          sVar5 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&module->funcs);
          anon_unknown_1::AppendInlineExportFields
                    (module,(ModuleFieldList *)local_88,(int)sVar5 - 1);
          RVar2 = Expect(this,Rpar);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            Result::Result((Result *)((long)&this_local + 4),Ok);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
        }
      }
      intrusive_list<wabt::ModuleField>::~intrusive_list
                ((intrusive_list<wabt::ModuleField> *)local_88);
      std::__cxx11::string::~string((string *)&export_fields.size_);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseFuncModuleField(Module* module) {
  WABT_TRACE(ParseFuncModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Func);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Func));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<FuncImport>(name);
    Func& func = import->func;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<FuncModuleField>(loc, name);
    Func& func = field->func;
    func.loc = GetLocation();
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));

    ResolveFuncs references(&func);

    CHECK_RESULT(ParseBoundValueTypeList(TokenType::Local, &references.types,
                                         &func.bindings, &references.vars,
                                         func.GetNumParams()));

    if (references.vars.empty()) {
      // No named references in the list, local types can be processed now.
      func.local_types.Set(references.types);
    } else {
      resolve_funcs_.push_back(references);
    }

    CHECK_RESULT(ParseTerminatingInstrList(&func.exprs));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->funcs.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}